

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cc
# Opt level: O3

int CRYPTO_BUFFER_cmp(CRYPTO_BUFFER *a,CRYPTO_BUFFER *b)

{
  size_t __n;
  int iVar1;
  
  if (a->pool == (CRYPTO_BUFFER_POOL *)0x0) {
    __assert_fail("a->pool != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool.cc"
                  ,0x24,"int CRYPTO_BUFFER_cmp(const CRYPTO_BUFFER *, const CRYPTO_BUFFER *)");
  }
  if (a->pool == b->pool) {
    __n = a->len;
    iVar1 = 1;
    if (__n == b->len) {
      if (__n != 0) {
        iVar1 = memcmp(a->data,b->data,__n);
        return iVar1;
      }
      iVar1 = 0;
    }
    return iVar1;
  }
  __assert_fail("a->pool == b->pool",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool.cc"
                ,0x25,"int CRYPTO_BUFFER_cmp(const CRYPTO_BUFFER *, const CRYPTO_BUFFER *)");
}

Assistant:

static int CRYPTO_BUFFER_cmp(const CRYPTO_BUFFER *a, const CRYPTO_BUFFER *b) {
  // Only |CRYPTO_BUFFER|s from the same pool have compatible hashes.
  assert(a->pool != NULL);
  assert(a->pool == b->pool);
  if (a->len != b->len) {
    return 1;
  }
  return OPENSSL_memcmp(a->data, b->data, a->len);
}